

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O2

wchar_t history_def_enter(void *p,HistEventW *ev,wchar_t *str)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  int *__ptr;
  wchar_t *pwVar4;
  hentry_t *extraout_RDX;
  hentry_t *hp;
  hentry_t *extraout_RDX_00;
  
  if ((((*(byte *)((long)p + 0x3c) & 1) != 0) && (*(void **)((long)p + 0x18) != p)) &&
     (iVar3 = wcscmp(*(wchar_t **)((long)*(void **)((long)p + 0x18) + 8),str), iVar3 == 0)) {
    return L'\0';
  }
  __ptr = (int *)malloc(0x28);
  if (__ptr != (int *)0x0) {
    pwVar4 = wcsdup(str);
    *(wchar_t **)(__ptr + 2) = pwVar4;
    if (pwVar4 != (wchar_t *)0x0) {
      __ptr[4] = 0;
      __ptr[5] = 0;
      lVar2 = *(long *)((long)p + 0x18);
      *(long *)(__ptr + 6) = lVar2;
      *(void **)(__ptr + 8) = p;
      *(int **)(lVar2 + 0x20) = __ptr;
      *(int **)((long)p + 0x18) = __ptr;
      uVar1 = *(undefined8 *)((long)p + 0x34);
      iVar3 = (int)((ulong)uVar1 >> 0x20) + 1;
      *__ptr = iVar3;
      *(ulong *)((long)p + 0x34) = CONCAT44(iVar3,(int)uVar1 + 1);
      *(int **)((long)p + 0x28) = __ptr;
      iVar3 = __ptr[1];
      ev->num = __ptr[0];
      *(int *)&ev->field_0x4 = iVar3;
      ev->str = *(wchar_t **)(__ptr + 2);
      hp = extraout_RDX;
      while( true ) {
        if (*(int *)((long)p + 0x34) < 1) {
          return L'\x01';
        }
        if (*(int *)((long)p + 0x34) <= *(int *)((long)p + 0x30)) break;
        history_def_delete((history_t *)p,*(HistEventW **)((long)p + 0x20),hp);
        hp = extraout_RDX_00;
      }
      return L'\x01';
    }
    free(__ptr);
  }
  ev->num = L'\x02';
  ev->str = anon_var_dwarf_6d3c;
  return L'\xffffffff';
}

Assistant:

static int
history_def_enter(void *p, TYPE(HistEvent) *ev, const Char *str)
{
	history_t *h = (history_t *) p;

	if ((h->flags & H_UNIQUE) != 0 && h->list.next != &h->list &&
	    Strcmp(h->list.next->ev.str, str) == 0)
	    return 0;

	if (history_def_insert(h, ev, str) == -1)
		return -1;	/* error, keep error message */

	/*
         * Always keep at least one entry.
         * This way we don't have to check for the empty list.
         */
	while (h->cur > h->max && h->cur > 0)
		history_def_delete(h, ev, h->list.prev);

	return 1;
}